

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::Pooling3DLayerParams::MergePartialFromCodedStream
          (Pooling3DLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  char cVar5;
  ulong uVar6;
  int32 *value_00;
  int value_1;
  int value;
  int local_90;
  int local_8c;
  int32 *local_88;
  int32 *local_80;
  int32 *local_78;
  int32 *local_70;
  int32 *local_68;
  int32 *local_60;
  int32 *local_58;
  int32 *local_50;
  int32 *local_48;
  int32 *local_40;
  bool *local_38;
  
  local_38 = &this->countexcludepadding_;
  local_40 = &this->custompaddingright_;
  local_48 = &this->custompaddingleft_;
  local_50 = &this->custompaddingbottom_;
  local_58 = &this->custompaddingtop_;
  local_60 = &this->custompaddingback_;
  local_68 = &this->custompaddingfront_;
  local_70 = &this->stridewidth_;
  local_78 = &this->strideheight_;
  local_80 = &this->stridedepth_;
  local_88 = &this->kernelwidth_;
LAB_0050780e:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00507831;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00507831:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) goto switchD_0050788b_default;
    cVar5 = (char)uVar6;
    switch((uint)(uVar6 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar5 == '\b') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&local_8c);
        if (!bVar3) {
          return false;
        }
        this->type_ = local_8c;
        goto LAB_0050780e;
      }
      break;
    case 2:
      value_00 = &this->kerneldepth_;
      if (cVar5 != '\x10') break;
LAB_005079f2:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,value_00);
      goto LAB_005079f7;
    case 3:
      value_00 = &this->kernelheight_;
      if (cVar5 == '\x18') goto LAB_005079f2;
      break;
    case 4:
      value_00 = local_88;
      if (cVar5 == ' ') goto LAB_005079f2;
      break;
    case 5:
      value_00 = local_80;
      if (cVar5 == '(') goto LAB_005079f2;
      break;
    case 6:
      value_00 = local_78;
      if (cVar5 == '0') goto LAB_005079f2;
      break;
    case 7:
      value_00 = local_70;
      if (cVar5 == '8') goto LAB_005079f2;
      break;
    case 8:
      value_00 = local_68;
      if (cVar5 == '@') goto LAB_005079f2;
      break;
    case 9:
      value_00 = local_60;
      if (cVar5 == 'H') goto LAB_005079f2;
      break;
    case 10:
      value_00 = local_58;
      if (cVar5 == 'P') goto LAB_005079f2;
      break;
    case 0xb:
      value_00 = local_50;
      if (cVar5 == 'X') goto LAB_005079f2;
      break;
    case 0xc:
      value_00 = local_48;
      if (cVar5 == '`') goto LAB_005079f2;
      break;
    case 0xd:
      value_00 = local_40;
      if (cVar5 == 'h') goto LAB_005079f2;
      break;
    case 0xe:
      if (cVar5 == 'p') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,local_38);
        goto LAB_005079f7;
      }
      break;
    case 0xf:
      if (cVar5 == 'x') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&local_90);
        if (!bVar3) {
          return false;
        }
        this->paddingtype_ = local_90;
        goto LAB_0050780e;
      }
    }
switchD_0050788b_default:
    if (uVar4 == 0) {
      return true;
    }
    if ((uVar4 & 7) == 4) {
      return true;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_005079f7:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Pooling3DLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Pooling3DLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::Pooling3DLayerParams_PoolingType3D >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelDepth = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kerneldepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelHeight = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelWidth = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideDepth = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridedepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideHeight = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &strideheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideWidth = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridewidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingFront = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingfront_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBack = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingback_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingTop = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingtop_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBottom = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingbottom_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingLeft = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingleft_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingRight = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingright_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool countExcludePadding = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &countexcludepadding_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_paddingtype(static_cast< ::CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Pooling3DLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Pooling3DLayerParams)
  return false;
#undef DO_
}